

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayUsageTests::init
          (SingleVertexArrayUsageTests *this,EVP_PKEY_CTX *ctx)

{
  void *pvVar1;
  SingleVertexArrayUsageGroup *this_00;
  uint local_3c;
  Usage local_38;
  int usageNdx;
  Usage usages [9];
  SingleVertexArrayUsageTests *this_local;
  
  unique0x100000a9 = this;
  pvVar1 = memcpy(&local_38,&DAT_012ccfd0,0x24);
  local_3c = 0;
  while ((int)local_3c < 9) {
    this_00 = (SingleVertexArrayUsageGroup *)operator_new(0x80);
    SingleVertexArrayUsageGroup::SingleVertexArrayUsageGroup
              (this_00,(this->super_TestCaseGroup).m_context,(&local_38)[(int)local_3c]);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    local_3c = local_3c + 1;
    pvVar1 = (void *)(ulong)local_3c;
  }
  return (int)pvVar1;
}

Assistant:

void SingleVertexArrayUsageTests::init (void)
{
	// Test usage
	Array::Usage		usages[]		= { Array::USAGE_STATIC_DRAW, Array::USAGE_STREAM_DRAW, Array::USAGE_DYNAMIC_DRAW, Array::USAGE_STATIC_COPY, Array::USAGE_STREAM_COPY, Array::USAGE_DYNAMIC_COPY, Array::USAGE_STATIC_READ, Array::USAGE_STREAM_READ, Array::USAGE_DYNAMIC_READ };
	for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
	{
		addChild(new SingleVertexArrayUsageGroup(m_context, usages[usageNdx]));
	}
}